

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

qpdflogger_handle qpdf_get_logger(qpdf_data qpdf)

{
  _qpdflogger_handle *this;
  shared_ptr<QPDFLogger> local_20;
  
  this = (_qpdflogger_handle *)operator_new(0x10);
  QPDF::getLogger((QPDF *)&local_20);
  _qpdflogger_handle::_qpdflogger_handle(this,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return this;
}

Assistant:

qpdflogger_handle
qpdf_get_logger(qpdf_data qpdf)
{
    return new _qpdflogger_handle(qpdf->qpdf->getLogger());
}